

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O1

string * StringBuilder<char[5],std::__cxx11::string&,char_const(&)[9],int,char_const(&)[4],int,char_const(&)[2]>
                   (string *__return_storage_ptr__,char (*arg) [5],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                   char (*args_1) [9],int *args_2,char (*args_3) [4],int *args_4,char (*args_5) [2])

{
  size_type *psVar1;
  undefined8 *puVar2;
  ulong uVar3;
  undefined8 uVar4;
  string local_70;
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  std::__cxx11::string::string((string *)&local_50,*arg,(allocator *)&local_70);
  StringBuilder<std::__cxx11::string,char_const(&)[9],int,char_const(&)[4],int,char_const(&)[2]>
            (&local_70,args,args_1,args_2,args_3,args_4,args_5);
  uVar3 = 0xf;
  if (local_50 != local_40) {
    uVar3 = local_40[0];
  }
  if (uVar3 < local_70._M_string_length + local_48) {
    uVar4 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      uVar4 = local_70.field_2._M_allocated_capacity;
    }
    if (local_70._M_string_length + local_48 <= (ulong)uVar4) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_50);
      goto LAB_001268db;
    }
  }
  puVar2 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70._M_dataplus._M_p);
LAB_001268db:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar2 + 2;
  if ((size_type *)*puVar2 == psVar1) {
    uVar4 = puVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar2[1];
  *puVar2 = psVar1;
  puVar2[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}